

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate_p.h
# Opt level: O0

void __thiscall
QNonContiguousByteDeviceThreadForwardImpl::QNonContiguousByteDeviceThreadForwardImpl
          (QNonContiguousByteDeviceThreadForwardImpl *this,bool aE,qint64 s)

{
  undefined8 in_RDX;
  byte in_SIL;
  QNonContiguousByteDevice *in_RDI;
  
  QNonContiguousByteDevice::QNonContiguousByteDevice(in_RDI);
  *(undefined ***)in_RDI = &PTR_metaObject_0049e9f0;
  in_RDI[0x10] = (QNonContiguousByteDevice)0x0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  QByteArray::QByteArray((QByteArray *)0x3220ca);
  in_RDI[0x40] = (QNonContiguousByteDevice)(in_SIL & 1);
  *(undefined8 *)(in_RDI + 0x48) = in_RDX;
  *(undefined8 *)(in_RDI + 0x50) = 0;
  return;
}

Assistant:

QNonContiguousByteDeviceThreadForwardImpl(bool aE, qint64 s)
        : QNonContiguousByteDevice(),
          m_atEnd(aE),
          m_size(s)
    {
    }